

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

Command ParseParams(Context *params)

{
  char cVar1;
  int iVar2;
  char **ppcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char *pcVar9;
  char *pcVar10;
  size_t __n;
  int iVar11;
  ulong local_98;
  size_t key_len;
  char *value;
  ulong uStack_78;
  char c;
  size_t j;
  size_t arg_len;
  char *arg;
  Command command;
  int after_dash_dash;
  int suffix_set;
  int lgwin_set;
  int keep_set;
  int output_set;
  int quality_set;
  int command_set;
  size_t longest_path_len;
  size_t input_count;
  int next_option_index;
  int i;
  char **argv;
  int argc;
  Context *params_local;
  
  iVar2 = params->argc;
  ppcVar3 = params->argv;
  input_count._0_4_ = 0;
  longest_path_len = 0;
  _quality_set = 1;
  bVar6 = false;
  keep_set = 0;
  bVar5 = false;
  bVar7 = false;
  after_dash_dash = 0;
  bVar8 = false;
  bVar4 = false;
  arg._0_4_ = ParseAlias(*ppcVar3);
  input_count._4_4_ = 1;
  do {
    if (iVar2 <= input_count._4_4_) {
      params->input_count = longest_path_len;
      params->longest_path_len = _quality_set;
      params->decompress = (uint)((Command)arg == COMMAND_DECOMPRESS);
      params->test_integrity = (uint)((Command)arg == COMMAND_TEST_INTEGRITY);
      if ((1 < longest_path_len) && (bVar5)) {
        return COMMAND_INVALID;
      }
      if (params->test_integrity != 0) {
        if (params->output_path != (char *)0x0) {
          return COMMAND_INVALID;
        }
        if (params->write_to_stdout != 0) {
          return COMMAND_INVALID;
        }
      }
      pcVar9 = strchr(params->suffix,0x2f);
      if ((pcVar9 == (char *)0x0) && (pcVar9 = strchr(params->suffix,0x5c), pcVar9 == (char *)0x0))
      {
        params_local._4_4_ = (Command)arg;
      }
      else {
        params_local._4_4_ = COMMAND_INVALID;
      }
      return params_local._4_4_;
    }
    pcVar9 = ppcVar3[input_count._4_4_];
    if (pcVar9 == (char *)0x0) {
      local_98 = 0;
    }
    else {
      local_98 = strlen(pcVar9);
    }
    if (local_98 == 0) {
      params->not_input_indices[(int)input_count] = input_count._4_4_;
      input_count._0_4_ = (int)input_count + 1;
    }
    else {
      if (0x12 < (int)input_count) {
        fprintf(_stderr,"too many options passed\n");
        return COMMAND_INVALID;
      }
      if (((bVar4) || (*pcVar9 != '-')) || (local_98 == 1)) {
        longest_path_len = longest_path_len + 1;
        if (_quality_set < local_98) {
          _quality_set = local_98;
        }
      }
      else {
        iVar11 = (int)input_count + 1;
        params->not_input_indices[(int)input_count] = input_count._4_4_;
        input_count._0_4_ = iVar11;
        if ((local_98 == 2) && (pcVar9[1] == '-')) {
          bVar4 = true;
        }
        else if (pcVar9[1] == '-') {
          pcVar9 = pcVar9 + 2;
          iVar11 = strcmp("best",pcVar9);
          if (iVar11 == 0) {
            if (keep_set != 0) {
              fprintf(_stderr,"quality already set\n");
              return COMMAND_INVALID;
            }
            keep_set = 1;
            params->quality = 0xb;
          }
          else {
            iVar11 = strcmp("decompress",pcVar9);
            if (iVar11 == 0) {
              if (bVar6) {
                fprintf(_stderr,"command already set when parsing --decompress\n");
                return COMMAND_INVALID;
              }
              bVar6 = true;
              arg._0_4_ = COMMAND_DECOMPRESS;
            }
            else {
              iVar11 = strcmp("force",pcVar9);
              if (iVar11 == 0) {
                if (params->force_overwrite != 0) {
                  fprintf(_stderr,"force output overwrite already set\n");
                  return COMMAND_INVALID;
                }
                params->force_overwrite = 1;
              }
              else {
                iVar11 = strcmp("help",pcVar9);
                if (iVar11 == 0) {
                  return COMMAND_HELP;
                }
                iVar11 = strcmp("keep",pcVar9);
                if (iVar11 == 0) {
                  if (bVar7) {
                    fprintf(_stderr,"argument --rm / -j or --keep / -k already set\n");
                    return COMMAND_INVALID;
                  }
                  bVar7 = true;
                  params->junk_source = 0;
                }
                else {
                  iVar11 = strcmp("no-copy-stat",pcVar9);
                  if (iVar11 == 0) {
                    if (params->copy_stat == 0) {
                      fprintf(_stderr,"argument --no-copy-stat / -n already set\n");
                      return COMMAND_INVALID;
                    }
                    params->copy_stat = 0;
                  }
                  else {
                    iVar11 = strcmp("rm",pcVar9);
                    if (iVar11 == 0) {
                      if (bVar7) {
                        fprintf(_stderr,"argument --rm / -j or --keep / -k already set\n");
                        return COMMAND_INVALID;
                      }
                      bVar7 = true;
                      params->junk_source = 1;
                    }
                    else {
                      iVar11 = strcmp("stdout",pcVar9);
                      if (iVar11 == 0) {
                        if (bVar5) {
                          fprintf(_stderr,"write to standard output already set\n");
                          return COMMAND_INVALID;
                        }
                        bVar5 = true;
                        params->write_to_stdout = 1;
                      }
                      else {
                        iVar11 = strcmp("test",pcVar9);
                        if (iVar11 == 0) {
                          if (bVar6) {
                            fprintf(_stderr,"command already set when parsing --test\n");
                            return COMMAND_INVALID;
                          }
                          bVar6 = true;
                          arg._0_4_ = COMMAND_TEST_INTEGRITY;
                        }
                        else {
                          iVar11 = strcmp("verbose",pcVar9);
                          if (iVar11 == 0) {
                            if (0 < params->verbosity) {
                              fprintf(_stderr,"argument --verbose / -v already set\n");
                              return COMMAND_INVALID;
                            }
                            params->verbosity = 1;
                          }
                          else {
                            iVar11 = strcmp("version",pcVar9);
                            if (iVar11 == 0) {
                              return COMMAND_VERSION;
                            }
                            pcVar10 = strrchr(pcVar9,0x3d);
                            if ((pcVar10 == (char *)0x0) || (pcVar10[1] == '\0')) {
                              fprintf(_stderr,"must pass the parameter as --%s=value\n",pcVar9);
                              return COMMAND_INVALID;
                            }
                            __n = (long)pcVar10 - (long)pcVar9;
                            pcVar10 = pcVar10 + 1;
                            iVar11 = strncmp("lgwin",pcVar9,__n);
                            if (iVar11 == 0) {
                              if (after_dash_dash != 0) {
                                fprintf(_stderr,"lgwin parameter already set\n");
                                return COMMAND_INVALID;
                              }
                              after_dash_dash = ParseInt(pcVar10,0,0x18,&params->lgwin);
                              if (after_dash_dash == 0) {
                                fprintf(_stderr,"error parsing lgwin value [%s]\n",pcVar10);
                                return COMMAND_INVALID;
                              }
                              if ((params->lgwin != 0) && (params->lgwin < 10)) {
                                fprintf(_stderr,
                                        "lgwin parameter (%d) smaller than the minimum (%d)\n",
                                        (ulong)(uint)params->lgwin,10);
                                return COMMAND_INVALID;
                              }
                            }
                            else {
                              iVar11 = strncmp("large_window",pcVar9,__n);
                              if (iVar11 == 0) {
                                if (after_dash_dash != 0) {
                                  fprintf(_stderr,"lgwin parameter already set\n");
                                  return COMMAND_INVALID;
                                }
                                after_dash_dash = ParseInt(pcVar10,0,0x1e,&params->lgwin);
                                if (after_dash_dash == 0) {
                                  fprintf(_stderr,"error parsing lgwin value [%s]\n",pcVar10);
                                  return COMMAND_INVALID;
                                }
                                if ((params->lgwin != 0) && (params->lgwin < 10)) {
                                  fprintf(_stderr,
                                          "lgwin parameter (%d) smaller than the minimum (%d)\n",
                                          (ulong)(uint)params->lgwin,10);
                                  return COMMAND_INVALID;
                                }
                              }
                              else {
                                iVar11 = strncmp("output",pcVar9,__n);
                                if (iVar11 == 0) {
                                  if (bVar5) {
                                    fprintf(_stderr,
                                            "write to standard output already set (--output)\n");
                                    return COMMAND_INVALID;
                                  }
                                  params->output_path = pcVar10;
                                }
                                else {
                                  iVar11 = strncmp("quality",pcVar9,__n);
                                  if (iVar11 == 0) {
                                    if (keep_set != 0) {
                                      fprintf(_stderr,"quality already set\n");
                                      return COMMAND_INVALID;
                                    }
                                    keep_set = ParseInt(pcVar10,0,0xb,&params->quality);
                                    if (keep_set == 0) {
                                      fprintf(_stderr,"error parsing quality value [%s]\n",pcVar10);
                                      return COMMAND_INVALID;
                                    }
                                  }
                                  else {
                                    iVar11 = strncmp("suffix",pcVar9,__n);
                                    if (iVar11 != 0) {
                                      fprintf(_stderr,"invalid parameter: [%s]\n",pcVar9);
                                      return COMMAND_INVALID;
                                    }
                                    if (bVar8) {
                                      fprintf(_stderr,"suffix already set\n");
                                      return COMMAND_INVALID;
                                    }
                                    bVar8 = true;
                                    params->suffix = pcVar10;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          for (uStack_78 = 1; uStack_78 < local_98; uStack_78 = uStack_78 + 1) {
            cVar1 = pcVar9[uStack_78];
            if ((cVar1 < '0') || ('9' < cVar1)) {
              if (cVar1 == 'c') {
                if (bVar5) {
                  fprintf(_stderr,"write to standard output already set\n");
                  return COMMAND_INVALID;
                }
                bVar5 = true;
                params->write_to_stdout = 1;
              }
              else if (cVar1 == 'd') {
                if (bVar6) {
                  fprintf(_stderr,"command already set when parsing -d\n");
                  return COMMAND_INVALID;
                }
                bVar6 = true;
                arg._0_4_ = COMMAND_DECOMPRESS;
              }
              else if (cVar1 == 'f') {
                if (params->force_overwrite != 0) {
                  fprintf(_stderr,"force output overwrite already set\n");
                  return COMMAND_INVALID;
                }
                params->force_overwrite = 1;
              }
              else {
                if (cVar1 == 'h') {
                  return COMMAND_HELP;
                }
                if ((cVar1 == 'j') || (cVar1 == 'k')) {
                  if (bVar7) {
                    fprintf(_stderr,"argument --rm / -j or --keep / -k already set\n");
                    return COMMAND_INVALID;
                  }
                  bVar7 = true;
                  params->junk_source = (uint)(cVar1 == 'j');
                }
                else if (cVar1 == 'n') {
                  if (params->copy_stat == 0) {
                    fprintf(_stderr,"argument --no-copy-stat / -n already set\n");
                    return COMMAND_INVALID;
                  }
                  params->copy_stat = 0;
                }
                else if (cVar1 == 't') {
                  if (bVar6) {
                    fprintf(_stderr,"command already set when parsing -t\n");
                    return COMMAND_INVALID;
                  }
                  bVar6 = true;
                  arg._0_4_ = COMMAND_TEST_INTEGRITY;
                }
                else if (cVar1 == 'v') {
                  if (0 < params->verbosity) {
                    fprintf(_stderr,"argument --verbose / -v already set\n");
                    return COMMAND_INVALID;
                  }
                  params->verbosity = 1;
                }
                else {
                  if (cVar1 == 'V') {
                    return COMMAND_VERSION;
                  }
                  if (cVar1 == 'Z') {
                    if (keep_set != 0) {
                      fprintf(_stderr,"quality already set\n");
                      return COMMAND_INVALID;
                    }
                    keep_set = 1;
                    params->quality = 0xb;
                  }
                  else {
                    if ((((cVar1 != 'o') && (cVar1 != 'q')) && (cVar1 != 'w')) &&
                       ((cVar1 != 'D' && (cVar1 != 'S')))) {
                      fprintf(_stderr,"invalid argument -%c\n",(ulong)(uint)(int)cVar1);
                      return COMMAND_INVALID;
                    }
                    if (uStack_78 + 1 != local_98) {
                      fprintf(_stderr,"expected parameter for argument -%c\n",
                              (ulong)(uint)(int)cVar1);
                      return COMMAND_INVALID;
                    }
                    input_count._4_4_ = input_count._4_4_ + 1;
                    if (((input_count._4_4_ == iVar2) || (ppcVar3[input_count._4_4_] == (char *)0x0)
                        ) || (*ppcVar3[input_count._4_4_] == '\0')) {
                      fprintf(_stderr,"expected parameter for argument -%c\n",
                              (ulong)(uint)(int)cVar1);
                      return COMMAND_INVALID;
                    }
                    iVar11 = (int)input_count + 1;
                    params->not_input_indices[(int)input_count] = input_count._4_4_;
                    input_count._0_4_ = iVar11;
                    if (cVar1 == 'o') {
                      if (bVar5) {
                        fprintf(_stderr,"write to standard output already set (-o)\n");
                        return COMMAND_INVALID;
                      }
                      params->output_path = ppcVar3[input_count._4_4_];
                    }
                    else if (cVar1 == 'q') {
                      if (keep_set != 0) {
                        fprintf(_stderr,"quality already set\n");
                        return COMMAND_INVALID;
                      }
                      keep_set = ParseInt(ppcVar3[input_count._4_4_],0,0xb,&params->quality);
                      if (keep_set == 0) {
                        fprintf(_stderr,"error parsing quality value [%s]\n",
                                ppcVar3[input_count._4_4_]);
                        return COMMAND_INVALID;
                      }
                    }
                    else if (cVar1 == 'w') {
                      if (after_dash_dash != 0) {
                        fprintf(_stderr,"lgwin parameter already set\n");
                        return COMMAND_INVALID;
                      }
                      after_dash_dash = ParseInt(ppcVar3[input_count._4_4_],0,0x18,&params->lgwin);
                      if (after_dash_dash == 0) {
                        fprintf(_stderr,"error parsing lgwin value [%s]\n",
                                ppcVar3[input_count._4_4_]);
                        return COMMAND_INVALID;
                      }
                      if ((params->lgwin != 0) && (params->lgwin < 10)) {
                        fprintf(_stderr,"lgwin parameter (%d) smaller than the minimum (%d)\n",
                                (ulong)(uint)params->lgwin,10);
                        return COMMAND_INVALID;
                      }
                    }
                    else if (cVar1 == 'S') {
                      if (bVar8) {
                        fprintf(_stderr,"suffix already set\n");
                        return COMMAND_INVALID;
                      }
                      bVar8 = true;
                      params->suffix = ppcVar3[input_count._4_4_];
                    }
                  }
                }
              }
            }
            else {
              if (keep_set != 0) {
                fprintf(_stderr,"quality already set\n");
                return COMMAND_INVALID;
              }
              keep_set = 1;
              params->quality = cVar1 + -0x30;
            }
          }
        }
      }
    }
    input_count._4_4_ = input_count._4_4_ + 1;
  } while( true );
}

Assistant:

static Command ParseParams(Context* params) {
  int argc = params->argc;
  char** argv = params->argv;
  int i;
  int next_option_index = 0;
  size_t input_count = 0;
  size_t longest_path_len = 1;
  BROTLI_BOOL command_set = BROTLI_FALSE;
  BROTLI_BOOL quality_set = BROTLI_FALSE;
  BROTLI_BOOL output_set = BROTLI_FALSE;
  BROTLI_BOOL keep_set = BROTLI_FALSE;
  BROTLI_BOOL lgwin_set = BROTLI_FALSE;
  BROTLI_BOOL suffix_set = BROTLI_FALSE;
  BROTLI_BOOL after_dash_dash = BROTLI_FALSE;
  Command command = ParseAlias(argv[0]);

  for (i = 1; i < argc; ++i) {
    const char* arg = argv[i];
    /* C99 5.1.2.2.1: "members argv[0] through argv[argc-1] inclusive shall
       contain pointers to strings"; NULL and 0-length are not forbidden. */
    size_t arg_len = arg ? strlen(arg) : 0;

    if (arg_len == 0) {
      params->not_input_indices[next_option_index++] = i;
      continue;
    }

    /* Too many options. The expected longest option list is:
       "-q 0 -w 10 -o f -D d -S b -d -f -k -n -v --", i.e. 16 items in total.
       This check is an additional guard that is never triggered, but provides
       a guard for future changes. */
    if (next_option_index > (MAX_OPTIONS - 2)) {
      fprintf(stderr, "too many options passed\n");
      return COMMAND_INVALID;
    }

    /* Input file entry. */
    if (after_dash_dash || arg[0] != '-' || arg_len == 1) {
      input_count++;
      if (longest_path_len < arg_len) longest_path_len = arg_len;
      continue;
    }

    /* Not a file entry. */
    params->not_input_indices[next_option_index++] = i;

    /* '--' entry stop parsing arguments. */
    if (arg_len == 2 && arg[1] == '-') {
      after_dash_dash = BROTLI_TRUE;
      continue;
    }

    /* Simple / coalesced options. */
    if (arg[1] != '-') {
      size_t j;
      for (j = 1; j < arg_len; ++j) {
        char c = arg[j];
        if (c >= '0' && c <= '9') {
          if (quality_set) {
            fprintf(stderr, "quality already set\n");
            return COMMAND_INVALID;
          }
          quality_set = BROTLI_TRUE;
          params->quality = c - '0';
          continue;
        } else if (c == 'c') {
          if (output_set) {
            fprintf(stderr, "write to standard output already set\n");
            return COMMAND_INVALID;
          }
          output_set = BROTLI_TRUE;
          params->write_to_stdout = BROTLI_TRUE;
          continue;
        } else if (c == 'd') {
          if (command_set) {
            fprintf(stderr, "command already set when parsing -d\n");
            return COMMAND_INVALID;
          }
          command_set = BROTLI_TRUE;
          command = COMMAND_DECOMPRESS;
          continue;
        } else if (c == 'f') {
          if (params->force_overwrite) {
            fprintf(stderr, "force output overwrite already set\n");
            return COMMAND_INVALID;
          }
          params->force_overwrite = BROTLI_TRUE;
          continue;
        } else if (c == 'h') {
          /* Don't parse further. */
          return COMMAND_HELP;
        } else if (c == 'j' || c == 'k') {
          if (keep_set) {
            fprintf(stderr, "argument --rm / -j or --keep / -k already set\n");
            return COMMAND_INVALID;
          }
          keep_set = BROTLI_TRUE;
          params->junk_source = TO_BROTLI_BOOL(c == 'j');
          continue;
        } else if (c == 'n') {
          if (!params->copy_stat) {
            fprintf(stderr, "argument --no-copy-stat / -n already set\n");
            return COMMAND_INVALID;
          }
          params->copy_stat = BROTLI_FALSE;
          continue;
        } else if (c == 't') {
          if (command_set) {
            fprintf(stderr, "command already set when parsing -t\n");
            return COMMAND_INVALID;
          }
          command_set = BROTLI_TRUE;
          command = COMMAND_TEST_INTEGRITY;
          continue;
        } else if (c == 'v') {
          if (params->verbosity > 0) {
            fprintf(stderr, "argument --verbose / -v already set\n");
            return COMMAND_INVALID;
          }
          params->verbosity = 1;
          continue;
        } else if (c == 'V') {
          /* Don't parse further. */
          return COMMAND_VERSION;
        } else if (c == 'Z') {
          if (quality_set) {
            fprintf(stderr, "quality already set\n");
            return COMMAND_INVALID;
          }
          quality_set = BROTLI_TRUE;
          params->quality = 11;
          continue;
        }
        /* o/q/w/D/S with parameter is expected */
        if (c != 'o' && c != 'q' && c != 'w' && c != 'D' && c != 'S') {
          fprintf(stderr, "invalid argument -%c\n", c);
          return COMMAND_INVALID;
        }
        if (j + 1 != arg_len) {
          fprintf(stderr, "expected parameter for argument -%c\n", c);
          return COMMAND_INVALID;
        }
        i++;
        if (i == argc || !argv[i] || argv[i][0] == 0) {
          fprintf(stderr, "expected parameter for argument -%c\n", c);
          return COMMAND_INVALID;
        }
        params->not_input_indices[next_option_index++] = i;
        if (c == 'o') {
          if (output_set) {
            fprintf(stderr, "write to standard output already set (-o)\n");
            return COMMAND_INVALID;
          }
          params->output_path = argv[i];
        } else if (c == 'q') {
          if (quality_set) {
            fprintf(stderr, "quality already set\n");
            return COMMAND_INVALID;
          }
          quality_set = ParseInt(argv[i], BROTLI_MIN_QUALITY,
                                 BROTLI_MAX_QUALITY, &params->quality);
          if (!quality_set) {
            fprintf(stderr, "error parsing quality value [%s]\n", argv[i]);
            return COMMAND_INVALID;
          }
        } else if (c == 'w') {
          if (lgwin_set) {
            fprintf(stderr, "lgwin parameter already set\n");
            return COMMAND_INVALID;
          }
          lgwin_set = ParseInt(argv[i], 0,
                               BROTLI_MAX_WINDOW_BITS, &params->lgwin);
          if (!lgwin_set) {
            fprintf(stderr, "error parsing lgwin value [%s]\n", argv[i]);
            return COMMAND_INVALID;
          }
          if (params->lgwin != 0 && params->lgwin < BROTLI_MIN_WINDOW_BITS) {
            fprintf(stderr,
                    "lgwin parameter (%d) smaller than the minimum (%d)\n",
                    params->lgwin, BROTLI_MIN_WINDOW_BITS);
            return COMMAND_INVALID;
          }
        } else if (c == 'S') {
          if (suffix_set) {
            fprintf(stderr, "suffix already set\n");
            return COMMAND_INVALID;
          }
          suffix_set = BROTLI_TRUE;
          params->suffix = argv[i];
        }
      }
    } else {  /* Double-dash. */
      arg = &arg[2];
      if (strcmp("best", arg) == 0) {
        if (quality_set) {
          fprintf(stderr, "quality already set\n");
          return COMMAND_INVALID;
        }
        quality_set = BROTLI_TRUE;
        params->quality = 11;
      } else if (strcmp("decompress", arg) == 0) {
        if (command_set) {
          fprintf(stderr, "command already set when parsing --decompress\n");
          return COMMAND_INVALID;
        }
        command_set = BROTLI_TRUE;
        command = COMMAND_DECOMPRESS;
      } else if (strcmp("force", arg) == 0) {
        if (params->force_overwrite) {
          fprintf(stderr, "force output overwrite already set\n");
          return COMMAND_INVALID;
        }
        params->force_overwrite = BROTLI_TRUE;
      } else if (strcmp("help", arg) == 0) {
        /* Don't parse further. */
        return COMMAND_HELP;
      } else if (strcmp("keep", arg) == 0) {
        if (keep_set) {
          fprintf(stderr, "argument --rm / -j or --keep / -k already set\n");
          return COMMAND_INVALID;
        }
        keep_set = BROTLI_TRUE;
        params->junk_source = BROTLI_FALSE;
      } else if (strcmp("no-copy-stat", arg) == 0) {
        if (!params->copy_stat) {
          fprintf(stderr, "argument --no-copy-stat / -n already set\n");
          return COMMAND_INVALID;
        }
        params->copy_stat = BROTLI_FALSE;
      } else if (strcmp("rm", arg) == 0) {
        if (keep_set) {
          fprintf(stderr, "argument --rm / -j or --keep / -k already set\n");
          return COMMAND_INVALID;
        }
        keep_set = BROTLI_TRUE;
        params->junk_source = BROTLI_TRUE;
      } else if (strcmp("stdout", arg) == 0) {
        if (output_set) {
          fprintf(stderr, "write to standard output already set\n");
          return COMMAND_INVALID;
        }
        output_set = BROTLI_TRUE;
        params->write_to_stdout = BROTLI_TRUE;
      } else if (strcmp("test", arg) == 0) {
        if (command_set) {
          fprintf(stderr, "command already set when parsing --test\n");
          return COMMAND_INVALID;
        }
        command_set = BROTLI_TRUE;
        command = COMMAND_TEST_INTEGRITY;
      } else if (strcmp("verbose", arg) == 0) {
        if (params->verbosity > 0) {
          fprintf(stderr, "argument --verbose / -v already set\n");
          return COMMAND_INVALID;
        }
        params->verbosity = 1;
      } else if (strcmp("version", arg) == 0) {
        /* Don't parse further. */
        return COMMAND_VERSION;
      } else {
        /* key=value */
        const char* value = strrchr(arg, '=');
        size_t key_len;
        if (!value || value[1] == 0) {
          fprintf(stderr, "must pass the parameter as --%s=value\n", arg);
          return COMMAND_INVALID;
        }
        key_len = (size_t)(value - arg);
        value++;
        if (strncmp("lgwin", arg, key_len) == 0) {
          if (lgwin_set) {
            fprintf(stderr, "lgwin parameter already set\n");
            return COMMAND_INVALID;
          }
          lgwin_set = ParseInt(value, 0,
                               BROTLI_MAX_WINDOW_BITS, &params->lgwin);
          if (!lgwin_set) {
            fprintf(stderr, "error parsing lgwin value [%s]\n", value);
            return COMMAND_INVALID;
          }
          if (params->lgwin != 0 && params->lgwin < BROTLI_MIN_WINDOW_BITS) {
            fprintf(stderr,
                    "lgwin parameter (%d) smaller than the minimum (%d)\n",
                    params->lgwin, BROTLI_MIN_WINDOW_BITS);
            return COMMAND_INVALID;
          }
        } else if (strncmp("large_window", arg, key_len) == 0) {
          /* This option is intentionally not mentioned in help. */
          if (lgwin_set) {
            fprintf(stderr, "lgwin parameter already set\n");
            return COMMAND_INVALID;
          }
          lgwin_set = ParseInt(value, 0,
                               BROTLI_LARGE_MAX_WINDOW_BITS, &params->lgwin);
          if (!lgwin_set) {
            fprintf(stderr, "error parsing lgwin value [%s]\n", value);
            return COMMAND_INVALID;
          }
          if (params->lgwin != 0 && params->lgwin < BROTLI_MIN_WINDOW_BITS) {
            fprintf(stderr,
                    "lgwin parameter (%d) smaller than the minimum (%d)\n",
                    params->lgwin, BROTLI_MIN_WINDOW_BITS);
            return COMMAND_INVALID;
          }
        } else if (strncmp("output", arg, key_len) == 0) {
          if (output_set) {
            fprintf(stderr,
                    "write to standard output already set (--output)\n");
            return COMMAND_INVALID;
          }
          params->output_path = value;
        } else if (strncmp("quality", arg, key_len) == 0) {
          if (quality_set) {
            fprintf(stderr, "quality already set\n");
            return COMMAND_INVALID;
          }
          quality_set = ParseInt(value, BROTLI_MIN_QUALITY,
                                 BROTLI_MAX_QUALITY, &params->quality);
          if (!quality_set) {
            fprintf(stderr, "error parsing quality value [%s]\n", value);
            return COMMAND_INVALID;
          }
        } else if (strncmp("suffix", arg, key_len) == 0) {
          if (suffix_set) {
            fprintf(stderr, "suffix already set\n");
            return COMMAND_INVALID;
          }
          suffix_set = BROTLI_TRUE;
          params->suffix = value;
        } else {
          fprintf(stderr, "invalid parameter: [%s]\n", arg);
          return COMMAND_INVALID;
        }
      }
    }
  }

  params->input_count = input_count;
  params->longest_path_len = longest_path_len;
  params->decompress = (command == COMMAND_DECOMPRESS);
  params->test_integrity = (command == COMMAND_TEST_INTEGRITY);

  if (input_count > 1 && output_set) return COMMAND_INVALID;
  if (params->test_integrity) {
    if (params->output_path) return COMMAND_INVALID;
    if (params->write_to_stdout) return COMMAND_INVALID;
  }
  if (strchr(params->suffix, '/') || strchr(params->suffix, '\\')) {
    return COMMAND_INVALID;
  }

  return command;
}